

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O0

void __thiscall hierarchy_info::resize(hierarchy_info *this,kmp_uint32 nproc)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  uint in_ESI;
  uint *in_RDI;
  bool bVar4;
  kmp_uint32 i_3;
  kmp_uint32 i_2;
  kmp_uint32 i_1;
  kmp_uint32 *old_skipPerLevel;
  kmp_uint32 *old_numPerLevel;
  kmp_uint32 i;
  kmp_uint32 old_maxLevels;
  kmp_uint32 incs;
  kmp_uint32 old_sz;
  kmp_int8 bool_result;
  undefined7 in_stack_ffffffffffffffb0;
  uint local_3c;
  uint local_38;
  uint local_34;
  void *ptr;
  uint local_20;
  int local_18;
  uint local_14;
  
  LOCK();
  bVar4 = *(char *)((long)in_RDI + 0xd) == '\0';
  if (bVar4) {
    *(char *)((long)in_RDI + 0xd) = '\x01';
  }
  UNLOCK();
  while( true ) {
    if (bVar4) {
      if (in_RDI[2] < in_ESI) {
        local_14 = *(uint *)(*(long *)(in_RDI + 6) + (ulong)(in_RDI[1] - 1) * 4);
        local_18 = 0;
        local_3c = *in_RDI;
        for (local_20 = in_RDI[1]; uVar1 = *in_RDI, bVar4 = local_14 < in_ESI,
            local_20 < uVar1 && bVar4; local_20 = local_20 + 1) {
          *(int *)(*(long *)(in_RDI + 6) + (ulong)local_20 * 4) =
               *(int *)(*(long *)(in_RDI + 6) + (ulong)(local_20 - 1) * 4) << 1;
          *(int *)(*(long *)(in_RDI + 4) + (ulong)(local_20 - 1) * 4) =
               *(int *)(*(long *)(in_RDI + 4) + (ulong)(local_20 - 1) * 4) << 1;
          local_14 = local_14 << 1;
          in_RDI[1] = in_RDI[1] + 1;
        }
        if (local_14 < in_ESI) {
          while (local_14 < in_ESI) {
            local_14 = local_14 << 1;
            local_18 = local_18 + 1;
            in_RDI[1] = in_RDI[1] + 1;
          }
          *in_RDI = local_18 + *in_RDI;
          lVar2 = *(long *)(in_RDI + 4);
          ptr = *(void **)(in_RDI + 6);
          in_RDI[6] = 0;
          in_RDI[7] = 0;
          in_RDI[4] = 0;
          in_RDI[5] = 0;
          pvVar3 = ___kmp_allocate(CONCAT17(local_20 < uVar1 && bVar4,in_stack_ffffffffffffffb0));
          *(void **)(in_RDI + 4) = pvVar3;
          *(ulong *)(in_RDI + 6) = *(long *)(in_RDI + 4) + (ulong)*in_RDI * 4;
          for (local_34 = 0; local_38 = local_3c, local_34 < local_3c; local_34 = local_34 + 1) {
            *(undefined4 *)(*(long *)(in_RDI + 4) + (ulong)local_34 * 4) =
                 *(undefined4 *)(lVar2 + (ulong)local_34 * 4);
            *(undefined4 *)(*(long *)(in_RDI + 6) + (ulong)local_34 * 4) =
                 *(undefined4 *)((long)ptr + (ulong)local_34 * 4);
          }
          for (; local_38 < *in_RDI; local_38 = local_38 + 1) {
            *(undefined4 *)(*(long *)(in_RDI + 4) + (ulong)local_38 * 4) = 1;
            *(undefined4 *)(*(long *)(in_RDI + 6) + (ulong)local_38 * 4) = 1;
          }
          ___kmp_free(ptr);
        }
        for (; local_3c < *in_RDI; local_3c = local_3c + 1) {
          *(int *)(*(long *)(in_RDI + 6) + (ulong)local_3c * 4) =
               *(int *)(*(long *)(in_RDI + 6) + (ulong)(local_3c - 1) * 4) << 1;
        }
        in_RDI[2] = in_ESI;
        *(undefined1 *)((long)in_RDI + 0xd) = 0;
      }
      return;
    }
    __kmp_x86_pause();
    if (in_ESI <= in_RDI[2]) break;
    LOCK();
    bVar4 = *(char *)((long)in_RDI + 0xd) == '\0';
    if (bVar4) {
      *(char *)((long)in_RDI + 0xd) = '\x01';
    }
    UNLOCK();
  }
  return;
}

Assistant:

void resize(kmp_uint32 nproc) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(&resizing, 0, 1);
    while (bool_result == 0) { // someone else is trying to resize
      KMP_CPU_PAUSE();
      if (nproc <= base_num_threads) // happy with other thread's resize
        return;
      else // try to resize
        bool_result = KMP_COMPARE_AND_STORE_ACQ8(&resizing, 0, 1);
    }
    KMP_DEBUG_ASSERT(bool_result != 0);
    if (nproc <= base_num_threads)
      return; // happy with other thread's resize

    // Calculate new maxLevels
    kmp_uint32 old_sz = skipPerLevel[depth - 1];
    kmp_uint32 incs = 0, old_maxLevels = maxLevels;
    // First see if old maxLevels is enough to contain new size
    for (kmp_uint32 i = depth; i < maxLevels && nproc > old_sz; ++i) {
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];
      numPerLevel[i - 1] *= 2;
      old_sz *= 2;
      depth++;
    }
    if (nproc > old_sz) { // Not enough space, need to expand hierarchy
      while (nproc > old_sz) {
        old_sz *= 2;
        incs++;
        depth++;
      }
      maxLevels += incs;

      // Resize arrays
      kmp_uint32 *old_numPerLevel = numPerLevel;
      kmp_uint32 *old_skipPerLevel = skipPerLevel;
      numPerLevel = skipPerLevel = NULL;
      numPerLevel =
          (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
      skipPerLevel = &(numPerLevel[maxLevels]);

      // Copy old elements from old arrays
      for (kmp_uint32 i = 0; i < old_maxLevels;
           ++i) { // init numPerLevel[*] to 1 item per level
        numPerLevel[i] = old_numPerLevel[i];
        skipPerLevel[i] = old_skipPerLevel[i];
      }

      // Init new elements in arrays to 1
      for (kmp_uint32 i = old_maxLevels; i < maxLevels;
           ++i) { // init numPerLevel[*] to 1 item per level
        numPerLevel[i] = 1;
        skipPerLevel[i] = 1;
      }

      // Free old arrays
      __kmp_free(old_numPerLevel);
    }

    // Fill in oversubscription levels of hierarchy
    for (kmp_uint32 i = old_maxLevels; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    base_num_threads = nproc;
    resizing = 0; // One writer
  }